

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusutil_p.h
# Opt level: O0

bool QDBusUtil::checkObjectPath(QString *path,AllowEmptyFlag empty,QDBusError *error)

{
  QLatin1StringView str;
  QAnyStringView s;
  QLatin1StringView latin1;
  bool bVar1;
  QAnyStringView *in_RDX;
  ErrorType in_ESI;
  QDBusError *in_RDI;
  long in_FS_OFFSET;
  ArgBase *argBases [2];
  QDBusError *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined4 in_stack_fffffffffffffe70;
  bool local_179;
  qsizetype in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  QString *in_stack_fffffffffffffea0;
  undefined1 local_140 [208];
  undefined1 local_70 [40];
  ulong local_48;
  ArgBase **local_40;
  ulong local_38;
  ArgBase **local_30;
  ulong local_28;
  ArgBase **local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x132e04);
  if (bVar1) {
    if (in_ESI == NoError) {
      local_179 = true;
    }
    else {
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_ESI,in_stack_fffffffffffffe70),(char *)in_RDX);
      latin1.m_data = in_stack_fffffffffffffe98;
      latin1.m_size = in_stack_fffffffffffffe90;
      QString::QString((QString *)CONCAT44(in_ESI,in_stack_fffffffffffffe70),latin1);
      QDBusError::QDBusError(in_RDI,in_ESI,(QString *)in_RDX);
      QDBusError::operator=
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      QDBusError::~QDBusError
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      QString::~QString((QString *)0x132e95);
      local_179 = false;
    }
  }
  else {
    bVar1 = isValidObjectPath(in_stack_fffffffffffffea0);
    if (bVar1) {
      local_179 = true;
    }
    else {
      QLatin1String::QLatin1String
                ((QLatin1String *)CONCAT44(in_ESI,in_stack_fffffffffffffe70),(char *)in_RDX);
      str.m_size._4_4_ = in_ESI;
      str.m_size._0_4_ = in_stack_fffffffffffffe70;
      str.m_data = (char *)in_RDI;
      QAnyStringView::QAnyStringView(in_RDX,str);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)CONCAT44(in_ESI,in_stack_fffffffffffffe70),(QString *)in_RDX);
      s.field_0._4_4_ = in_ESI;
      s.field_0._0_4_ = in_stack_fffffffffffffe70;
      s.m_size = (size_t)in_RDI;
      QtPrivate::qStringLikeToArg(s);
      local_28 = local_48;
      local_20 = local_40;
      local_18 = local_70;
      local_10 = 0;
      local_38 = local_48;
      local_30 = local_40;
      QtPrivate::argToQString((QAnyStringView *)local_140,local_48,local_40);
      QDBusError::QDBusError(in_RDI,in_ESI,(QString *)in_RDX);
      QDBusError::operator=
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      QDBusError::~QDBusError
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      QString::~QString((QString *)0x133045);
      local_179 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_179;
  }
  __stack_chk_fail();
}

Assistant:

inline bool checkObjectPath(const QString &path, AllowEmptyFlag empty, QDBusError *error)
    {
        if (path.isEmpty()) {
            if (empty == EmptyAllowed) return true;
            *error = QDBusError(QDBusError::InvalidObjectPath, QLatin1StringView("Object path cannot be empty"));
            return false;
        }
        if (isValidObjectPath(path)) return true;
        *error = QDBusError(QDBusError::InvalidObjectPath, QLatin1StringView("Invalid object path: %1").arg(path));
        return false;
    }